

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void simpleexp(LexState *ls,expdesc *v)

{
  int iVar1;
  FuncState *fs;
  expdesc *v_local;
  LexState *ls_local;
  
  iVar1 = (ls->t).token;
  if (iVar1 == 0x7b) {
    constructor(ls,v);
  }
  else {
    if (iVar1 == 0x107) {
      init_exp(v,VFALSE,0);
    }
    else {
      if (iVar1 == 0x109) {
        luaX_next(ls);
        body(ls,v,0,ls->linenumber);
        return;
      }
      if (iVar1 == 0x10e) {
        init_exp(v,VNIL,0);
      }
      else if (iVar1 == 0x114) {
        init_exp(v,VTRUE,0);
      }
      else if (iVar1 == 0x119) {
        if (ls->fs->f->is_vararg == '\0') {
          luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
        }
        iVar1 = luaK_codeABC(ls->fs,OP_VARARG,0,1,0);
        init_exp(v,VVARARG,iVar1);
      }
      else if (iVar1 == 0x122) {
        init_exp(v,VKFLT,0);
        v->u = *(anon_union_8_4_e6d17769_for_u *)&(ls->t).seminfo;
      }
      else if (iVar1 == 0x123) {
        init_exp(v,VKINT,0);
        v->u = *(anon_union_8_4_e6d17769_for_u *)&(ls->t).seminfo;
      }
      else {
        if (iVar1 != 0x125) {
          suffixedexp(ls,v);
          return;
        }
        codestring(ls,v,(ls->t).seminfo.ts);
      }
    }
    luaX_next(ls);
  }
  return;
}

Assistant:

static void simpleexp (LexState *ls, expdesc *v) {
  /* simpleexp -> FLT | INT | STRING | NIL | TRUE | FALSE | ... |
                  constructor | FUNCTION body | suffixedexp */
  switch (ls->t.token) {
    case TK_FLT: {
      init_exp(v, VKFLT, 0);
      v->u.nval = ls->t.seminfo.r;
      break;
    }
    case TK_INT: {
      init_exp(v, VKINT, 0);
      v->u.ival = ls->t.seminfo.i;
      break;
    }
    case TK_STRING: {
      codestring(ls, v, ls->t.seminfo.ts);
      break;
    }
    case TK_NIL: {
      init_exp(v, VNIL, 0);
      break;
    }
    case TK_TRUE: {
      init_exp(v, VTRUE, 0);
      break;
    }
    case TK_FALSE: {
      init_exp(v, VFALSE, 0);
      break;
    }
    case TK_DOTS: {  /* vararg */
      FuncState *fs = ls->fs;
      check_condition(ls, fs->f->is_vararg,
                      "cannot use '...' outside a vararg function");
      init_exp(v, VVARARG, luaK_codeABC(fs, OP_VARARG, 0, 1, 0));
      break;
    }
    case '{': {  /* constructor */
      constructor(ls, v);
      return;
    }
    case TK_FUNCTION: {
      luaX_next(ls);
      body(ls, v, 0, ls->linenumber);
      return;
    }
    default: {
      suffixedexp(ls, v);
      return;
    }
  }
  luaX_next(ls);
}